

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfa.cc
# Opt level: O0

bool __thiscall
re2::NFA::Search(NFA *this,StringPiece *text,StringPiece *const_context,bool anchored,bool longest,
                StringPiece *submatch,int nsubmatch)

{
  undefined1 auVar1 [16];
  undefined8 uVar2;
  undefined4 uVar3;
  Threadq *pTVar4;
  Threadq *runq_00;
  bool bVar5;
  bool bVar6;
  int iVar7;
  InstOp IVar8;
  uint __c;
  iterator pcVar9;
  ostream *poVar10;
  ulong uVar11;
  char **ppcVar12;
  iterator pcVar13;
  byte *pbVar14;
  byte *pbVar15;
  byte *pbVar16;
  pointer pIVar17;
  StringPiece haystack;
  StringPiece needle;
  uint local_6b4;
  uint local_63c;
  int local_554;
  iterator iStack_550;
  int i_1;
  __normal_iterator<re2::SparseArray<re2::NFA::Thread_*>::IndexValue_*,_std::vector<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_std::allocator<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>_>_>
  local_548;
  iterator i;
  Thread *t;
  undefined1 local_530 [4];
  int fb;
  Inst *local_3b0;
  Inst *ip;
  uint local_3a0;
  int id;
  int isword;
  int flag;
  char *p;
  SparseArray<re2::NFA::Thread_*> *pSStack_388;
  int wasword;
  Threadq *nextq;
  Threadq *runq;
  LogMessage local_1e8;
  char *local_68;
  undefined4 local_60;
  undefined4 uStack_5c;
  char *local_58;
  undefined4 local_50;
  undefined4 uStack_4c;
  undefined1 local_48 [8];
  StringPiece context;
  StringPiece *submatch_local;
  bool longest_local;
  bool anchored_local;
  StringPiece *const_context_local;
  StringPiece *text_local;
  NFA *this_local;
  
  if (this->start_ == 0) {
    return false;
  }
  local_48 = (undefined1  [8])const_context->ptr_;
  context.ptr_ = *(char **)&const_context->length_;
  context._8_8_ = submatch;
  pcVar9 = StringPiece::begin((StringPiece *)local_48);
  if (pcVar9 == (iterator)0x0) {
    local_48 = (undefined1  [8])text->ptr_;
    context.ptr_ = (char *)CONCAT44(context.ptr_._4_4_,text->length_);
  }
  local_58 = (char *)local_48;
  local_50 = SUB84(context.ptr_,0);
  uStack_4c = (undefined4)((ulong)context.ptr_ >> 0x20);
  local_68 = text->ptr_;
  uVar2 = text->ptr_;
  uVar3 = text->length_;
  needle.length_ = uVar3;
  needle.ptr_ = (char *)uVar2;
  local_60 = (undefined4)*(undefined8 *)&text->length_;
  uStack_5c = (undefined4)((ulong)*(undefined8 *)&text->length_ >> 0x20);
  haystack.length_ = local_50;
  haystack.ptr_ = (char *)local_48;
  haystack._12_4_ = 0;
  needle._12_4_ = 0;
  bVar5 = StringPieceContains(haystack,needle);
  if (!bVar5) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_1e8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/nfa.cc",0x1bd);
    poVar10 = LogMessage::stream(&local_1e8);
    poVar10 = std::operator<<(poVar10,"Bad args: context does not contain text ");
    pcVar9 = StringPiece::begin((StringPiece *)local_48);
    poVar10 = (ostream *)std::ostream::operator<<(poVar10,pcVar9);
    poVar10 = std::operator<<(poVar10,"+");
    iVar7 = StringPiece::size((StringPiece *)local_48);
    poVar10 = (ostream *)std::ostream::operator<<(poVar10,iVar7);
    poVar10 = std::operator<<(poVar10," ");
    pcVar9 = StringPiece::begin(text);
    poVar10 = (ostream *)std::ostream::operator<<(poVar10,pcVar9);
    poVar10 = std::operator<<(poVar10,"+");
    iVar7 = StringPiece::size(text);
    std::ostream::operator<<(poVar10,iVar7);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1e8);
    return false;
  }
  bVar5 = Prog::anchor_start(this->prog_);
  if (bVar5) {
    pcVar9 = StringPiece::begin((StringPiece *)local_48);
    pcVar13 = StringPiece::begin(text);
    if (pcVar9 != pcVar13) {
      return false;
    }
  }
  bVar5 = Prog::anchor_end(this->prog_);
  if (bVar5) {
    pcVar9 = StringPiece::end((StringPiece *)local_48);
    pcVar13 = StringPiece::end(text);
    if (pcVar9 != pcVar13) {
      return false;
    }
  }
  bVar5 = Prog::anchor_start(this->prog_);
  bVar6 = Prog::anchor_end(this->prog_);
  submatch_local._6_1_ = longest;
  if (bVar6) {
    submatch_local._6_1_ = 1;
    this->endmatch_ = true;
    pcVar9 = StringPiece::end(text);
    this->etext_ = pcVar9;
  }
  if (nsubmatch < 0) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&runq,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/nfa.cc",0x1d1);
    poVar10 = LogMessage::stream((LogMessage *)&runq);
    poVar10 = std::operator<<(poVar10,"Bad args: nsubmatch=");
    std::ostream::operator<<(poVar10,nsubmatch);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&runq);
    return false;
  }
  this->ncapture_ = nsubmatch << 1;
  this->longest_ = (bool)(submatch_local._6_1_ & 1);
  if (nsubmatch == 0) {
    this->ncapture_ = 2;
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)this->ncapture_;
  uVar11 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar11 = 0xffffffffffffffff;
  }
  ppcVar12 = (char **)operator_new__(uVar11);
  this->match_ = ppcVar12;
  this->matched_ = false;
  pcVar9 = StringPiece::begin((StringPiece *)local_48);
  this->btext_ = pcVar9;
  nextq = &this->q0_;
  pSStack_388 = &this->q1_;
  SparseArray<re2::NFA::Thread_*>::clear(nextq);
  SparseArray<re2::NFA::Thread_*>::clear(pSStack_388);
  memset(this->match_,0,(long)this->ncapture_ << 3);
  p._4_4_ = 0;
  pcVar9 = StringPiece::begin(text);
  pcVar13 = StringPiece::begin((StringPiece *)local_48);
  if (pcVar13 < pcVar9) {
    pcVar9 = StringPiece::begin(text);
    bVar6 = Prog::IsWordChar(pcVar9[-1]);
    p._4_4_ = (uint)bVar6;
  }
  _isword = (byte *)StringPiece::begin(text);
  while( true ) {
    pbVar16 = _isword;
    id = 0;
    pbVar14 = (byte *)StringPiece::begin((StringPiece *)local_48);
    pbVar15 = _isword;
    if (pbVar16 == pbVar14) {
      id = id | 5;
    }
    else {
      pbVar16 = (byte *)StringPiece::end((StringPiece *)local_48);
      if ((pbVar15 <= pbVar16) && (_isword[-1] == 10)) {
        id = id | 1;
      }
    }
    pbVar16 = _isword;
    pbVar14 = (byte *)StringPiece::end((StringPiece *)local_48);
    pbVar15 = _isword;
    if (pbVar16 == pbVar14) {
      id = id | 10;
    }
    else {
      pbVar16 = (byte *)StringPiece::end((StringPiece *)local_48);
      if ((pbVar15 < pbVar16) && (*_isword == 10)) {
        id = id | 2;
      }
    }
    pbVar16 = _isword;
    local_3a0 = 0;
    pbVar15 = (byte *)StringPiece::end((StringPiece *)local_48);
    if (pbVar16 < pbVar15) {
      bVar6 = Prog::IsWordChar(*_isword);
      local_3a0 = (uint)bVar6;
    }
    runq_00 = nextq;
    pTVar4 = pSStack_388;
    pbVar16 = _isword;
    if (local_3a0 == p._4_4_) {
      id = id | 0x20;
    }
    else {
      id = id | 0x10;
    }
    pbVar15 = (byte *)StringPiece::end(text);
    if (pbVar16 < pbVar15) {
      local_63c = (uint)*_isword;
    }
    else {
      local_63c = 0xffffffff;
    }
    ip._4_4_ = Step(this,runq_00,pTVar4,local_63c,id,(char *)(_isword + -1));
    iVar7 = SparseArray<re2::NFA::Thread_*>::size(nextq);
    if (iVar7 != 0) {
      __assert_fail("(runq->size()) == (0)",
                    "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/nfa.cc",
                    0x22b,
                    "bool re2::NFA::Search(const StringPiece &, const StringPiece &, bool, bool, StringPiece *, int)"
                   );
    }
    std::swap<re2::SparseArray<re2::NFA::Thread*>*>(&stack0xfffffffffffffc78,&nextq);
    SparseArray<re2::NFA::Thread_*>::clear(pSStack_388);
    pbVar16 = _isword;
    if (ip._4_4_ != 0) {
      _isword = (byte *)StringPiece::end(text);
      goto LAB_00170430;
    }
    pbVar14 = (byte *)StringPiece::end(text);
    pbVar15 = _isword;
    if (pbVar14 < pbVar16) break;
    if (((this->matched_ & 1U) == 0) &&
       ((!anchored && !bVar5 || (pbVar16 = (byte *)StringPiece::begin(text), pbVar15 == pbVar16))))
    {
      __c = Prog::first_byte(this->prog_);
      if ((!anchored && !bVar5) &&
         ((((iVar7 = SparseArray<re2::NFA::Thread_*>::size(nextq), pbVar16 = _isword, iVar7 == 0 &&
            (-1 < (int)__c)) &&
           (pbVar14 = (byte *)StringPiece::end(text), pbVar15 = _isword, pbVar16 < pbVar14)) &&
          (*_isword != __c)))) {
        pcVar9 = StringPiece::end(text);
        _isword = (byte *)memchr(pbVar15,__c,(long)pcVar9 - (long)_isword);
        if (_isword == (byte *)0x0) {
          _isword = (byte *)StringPiece::end(text);
          local_3a0 = 0;
        }
        else {
          bVar6 = Prog::IsWordChar(*_isword);
          local_3a0 = (uint)bVar6;
        }
        id = Prog::EmptyFlags((StringPiece *)local_48,(char *)_isword);
      }
      i._M_current = (IndexValue *)AllocThread(this);
      CopyCapture(this,((Thread *)i._M_current)->capture,this->match_);
      pTVar4 = nextq;
      pbVar16 = _isword;
      **(undefined8 **)&(i._M_current)->index_ = _isword;
      iVar7 = this->start_;
      pbVar15 = (byte *)StringPiece::end(text);
      if (pbVar16 < pbVar15) {
        local_6b4 = (uint)*_isword;
      }
      else {
        local_6b4 = 0xffffffff;
      }
      AddToThreadq(this,pTVar4,iVar7,local_6b4,id,(char *)_isword,(Thread *)i._M_current);
      Decref(this,(Thread *)i._M_current);
    }
    iVar7 = SparseArray<re2::NFA::Thread_*>::size(nextq);
    if (iVar7 == 0) break;
    p._4_4_ = local_3a0;
    _isword = _isword + 1;
  }
LAB_001708ae:
  local_548._M_current = (IndexValue *)SparseArray<re2::NFA::Thread_*>::begin(nextq);
  while( true ) {
    iStack_550 = SparseArray<re2::NFA::Thread_*>::end(nextq);
    bVar5 = __gnu_cxx::operator!=(&local_548,&stack0xfffffffffffffab0);
    if (!bVar5) break;
    pIVar17 = __gnu_cxx::
              __normal_iterator<re2::SparseArray<re2::NFA::Thread_*>::IndexValue_*,_std::vector<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_std::allocator<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>_>_>
              ::operator->(&local_548);
    Decref(this,pIVar17->second);
    __gnu_cxx::
    __normal_iterator<re2::SparseArray<re2::NFA::Thread_*>::IndexValue_*,_std::vector<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_std::allocator<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>_>_>
    ::operator++(&local_548);
  }
  if ((this->matched_ & 1U) == 0) {
    this_local._7_1_ = false;
  }
  else {
    for (local_554 = 0; local_554 < nsubmatch; local_554 = local_554 + 1) {
      StringPiece::set((StringPiece *)(context._8_8_ + (long)local_554 * 0x10),
                       this->match_[local_554 << 1],
                       (int)this->match_[local_554 * 2 + 1] - (int)this->match_[local_554 << 1]);
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
LAB_00170430:
  while( true ) {
    local_3b0 = Prog::inst(this->prog_,ip._4_4_);
    IVar8 = Prog::Inst::opcode(local_3b0);
    if (IVar8 != kInstCapture) break;
    iVar7 = Prog::Inst::cap(local_3b0);
    pbVar16 = _isword;
    if (iVar7 < this->ncapture_) {
      ppcVar12 = this->match_;
      iVar7 = Prog::Inst::cap(local_3b0);
      ppcVar12[iVar7] = (char *)pbVar16;
    }
    ip._4_4_ = Prog::Inst::out(local_3b0);
  }
  if (IVar8 == kInstMatch) {
    this->match_[1] = (char *)_isword;
    this->matched_ = true;
    goto LAB_001708ae;
  }
  if (IVar8 != kInstNop) goto LAB_0017048d;
  ip._4_4_ = Prog::Inst::out(local_3b0);
  goto LAB_00170430;
LAB_0017048d:
  LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)local_530,
             "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/nfa.cc",0x235);
  poVar10 = LogMessage::stream((LogMessage *)local_530);
  poVar10 = std::operator<<(poVar10,"Unexpected opcode in short circuit: ");
  IVar8 = Prog::Inst::opcode(local_3b0);
  std::ostream::operator<<(poVar10,IVar8);
  LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_530);
  goto LAB_001708ae;
}

Assistant:

bool NFA::Search(const StringPiece& text, const StringPiece& const_context,
            bool anchored, bool longest,
            StringPiece* submatch, int nsubmatch) {
  if (start_ == 0)
    return false;

  StringPiece context = const_context;
  if (context.begin() == NULL)
    context = text;

  if (!StringPieceContains(context, text)) {
    LOG(FATAL) << "Bad args: context does not contain text "
                << reinterpret_cast<const void*>(context.begin())
                << "+" << context.size() << " "
                << reinterpret_cast<const void*>(text.begin())
                << "+" << text.size();
    return false;
  }

  if (prog_->anchor_start() && context.begin() != text.begin())
    return false;
  if (prog_->anchor_end() && context.end() != text.end())
    return false;
  anchored |= prog_->anchor_start();
  if (prog_->anchor_end()) {
    longest = true;
    endmatch_ = true;
    etext_ = text.end();
  }

  if (nsubmatch < 0) {
    LOG(DFATAL) << "Bad args: nsubmatch=" << nsubmatch;
    return false;
  }

  // Save search parameters.
  ncapture_ = 2*nsubmatch;
  longest_ = longest;

  if (nsubmatch == 0) {
    // We need to maintain match[0], both to distinguish the
    // longest match (if longest is true) and also to tell
    // whether we've seen any matches at all.
    ncapture_ = 2;
  }

  match_ = new const char*[ncapture_];
  matched_ = false;

  // For debugging prints.
  btext_ = context.begin();

  if (Debug) {
    fprintf(stderr, "NFA::Search %s (context: %s) anchored=%d longest=%d\n",
            text.as_string().c_str(), context.as_string().c_str(), anchored,
            longest);
  }

  // Set up search.
  Threadq* runq = &q0_;
  Threadq* nextq = &q1_;
  runq->clear();
  nextq->clear();
  memset(&match_[0], 0, ncapture_*sizeof match_[0]);
  int wasword = 0;

  if (text.begin() > context.begin())
    wasword = Prog::IsWordChar(text.begin()[-1] & 0xFF);

  // Loop over the text, stepping the machine.
  for (const char* p = text.begin();; p++) {
    // Check for empty-width specials.
    int flag = 0;

    // ^ and \A
    if (p == context.begin())
      flag |= kEmptyBeginText | kEmptyBeginLine;
    else if (p <= context.end() && p[-1] == '\n')
      flag |= kEmptyBeginLine;

    // $ and \z
    if (p == context.end())
      flag |= kEmptyEndText | kEmptyEndLine;
    else if (p < context.end() && p[0] == '\n')
      flag |= kEmptyEndLine;

    // \b and \B
    int isword = 0;
    if (p < context.end())
      isword = Prog::IsWordChar(p[0] & 0xFF);

    if (isword != wasword)
      flag |= kEmptyWordBoundary;
    else
      flag |= kEmptyNonWordBoundary;

    if (Debug) {
      int c = 0;
      if (p == context.begin())
        c = '^';
      else if (p > text.end())
        c = '$';
      else if (p < text.end())
        c = p[0] & 0xFF;

      fprintf(stderr, "%c[%#x/%d/%d]:", c, flag, isword, wasword);
      for (Threadq::iterator i = runq->begin(); i != runq->end(); ++i) {
        Thread* t = i->second;
        if (t == NULL)
          continue;
        fprintf(stderr, " %d%s", i->index(), FormatCapture(t->capture).c_str());
      }
      fprintf(stderr, "\n");
    }

    // Note that we pass p-1 to Step() because it needs the previous pointer
    // value in order to handle Match instructions appropriately. It plumbs
    // c and flag through to AddToThreadq() along with p-1+1, which is p.
    //
    // This is a no-op the first time around the loop because runq is empty.
    int id = Step(runq, nextq, p < text.end() ? p[0] & 0xFF : -1, flag, p-1);
    DCHECK_EQ(runq->size(), 0);
    swap(nextq, runq);
    nextq->clear();
    if (id != 0) {
      // We're done: full match ahead.
      p = text.end();
      for (;;) {
        Prog::Inst* ip = prog_->inst(id);
        switch (ip->opcode()) {
          default:
            LOG(DFATAL) << "Unexpected opcode in short circuit: " << ip->opcode();
            break;

          case kInstCapture:
            if (ip->cap() < ncapture_)
              match_[ip->cap()] = p;
            id = ip->out();
            continue;

          case kInstNop:
            id = ip->out();
            continue;

          case kInstMatch:
            match_[1] = p;
            matched_ = true;
            break;
        }
        break;
      }
      break;
    }

    if (p > text.end())
      break;

    // Start a new thread if there have not been any matches.
    // (No point in starting a new thread if there have been
    // matches, since it would be to the right of the match
    // we already found.)
    if (!matched_ && (!anchored || p == text.begin())) {
      // If there's a required first byte for an unanchored search
      // and we're not in the middle of any possible matches,
      // use memchr to search for the byte quickly.
      int fb = prog_->first_byte();
      if (!anchored && runq->size() == 0 &&
          fb >= 0 && p < text.end() && (p[0] & 0xFF) != fb) {
        p = reinterpret_cast<const char*>(memchr(p, fb, text.end() - p));
        if (p == NULL) {
          p = text.end();
          isword = 0;
        } else {
          isword = Prog::IsWordChar(p[0] & 0xFF);
        }
        flag = Prog::EmptyFlags(context, p);
      }

      Thread* t = AllocThread();
      CopyCapture(t->capture, match_);
      t->capture[0] = p;
      AddToThreadq(runq, start_, p < text.end() ? p[0] & 0xFF : -1, flag, p, t);
      Decref(t);
    }

    // If all the threads have died, stop early.
    if (runq->size() == 0) {
      if (Debug)
        fprintf(stderr, "dead\n");
      break;
    }

    wasword = isword;
  }

  for (Threadq::iterator i = runq->begin(); i != runq->end(); ++i)
    Decref(i->second);

  if (matched_) {
    for (int i = 0; i < nsubmatch; i++)
      submatch[i].set(match_[2*i],
                      static_cast<int>(match_[2*i+1] - match_[2*i]));
    if (Debug)
      fprintf(stderr, "match (%d,%d)\n",
              static_cast<int>(match_[0] - btext_),
              static_cast<int>(match_[1] - btext_));
    return true;
  }
  VLOG(1) << "No matches found";
  return false;
}